

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_write.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  nettlp_pcie_cfg *__buf;
  char *pcVar4;
  size_t sStack_60;
  uint16_t addr;
  uint32_t data;
  uint local_44;
  nettlp_pcie_cfg ntpc;
  
  addr = 0;
  data = 0;
  ntpc.sockfd = 0;
  ntpc.remote_addr.s_addr = 0;
  ntpc.local_addr.s_addr = 0;
  uVar2 = 0;
LAB_001022b2:
  do {
    while (local_44 = uVar2, iVar1 = getopt(argc,argv,"r:l:a:d:s:h"), iVar1 == 0x61) {
      iVar1 = __isoc99_sscanf(_optarg,"0x%hx",&addr);
      uVar2 = local_44;
      if (iVar1 < 1) {
        pcVar4 = "invalid address\n";
        sStack_60 = 0x10;
LAB_001023e1:
        fwrite(pcVar4,sStack_60,1,_stderr);
        return -1;
      }
    }
    if (iVar1 != 100) {
      __buf = (nettlp_pcie_cfg *)&ntpc.local_addr;
      if (iVar1 != 0x6c) {
        if (iVar1 != 0x72) {
          if (iVar1 == -1) {
            iVar1 = nettlp_pcie_cfg_init(&ntpc);
            if (iVar1 < 0) {
              pcVar4 = "nettlp_pcie_cfg_init";
            }
            else {
              sVar3 = nettlp_pcie_cfg_write(&ntpc,addr,&data,(ulong)local_44);
              if (-1 < (int)sVar3) {
                return 0;
              }
              pcVar4 = "nettlp_pcie_cfg_write";
            }
            goto LAB_001023f3;
          }
          if (iVar1 != 0x73) {
            usage();
            return -1;
          }
          uVar2 = atoi(_optarg);
          if (4 < uVar2) {
            pcVar4 = "invalid size\n";
            goto LAB_001023df;
          }
          goto LAB_001022b2;
        }
        __buf = &ntpc;
      }
      iVar1 = inet_pton(2,_optarg,__buf);
      uVar2 = local_44;
      if (iVar1 < 1) {
        pcVar4 = "inet_pton";
LAB_001023f3:
        perror(pcVar4);
        return -1;
      }
      goto LAB_001022b2;
    }
    iVar1 = __isoc99_sscanf(_optarg,"0x%x",&data);
    uVar2 = local_44;
    if (iVar1 < 1) {
      pcVar4 = "invalid data\n";
LAB_001023df:
      sStack_60 = 0xd;
      goto LAB_001023e1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch;
	int size = 0;
	uint16_t addr = 0;
	uint32_t data = 0;
	struct nettlp_pcie_cfg ntpc;

	memset(&ntpc, 0, sizeof(ntpc));

	while ((ch = getopt(argc, argv, "r:l:a:d:s:h")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &ntpc.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &ntpc.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'a':
			ret = sscanf(optarg, "0x%hx", &addr);
			if (ret < 1) {
				fprintf(stderr, "invalid address\n");
				return -1;
			}
			break;
				
		case 'd':
			ret = sscanf(optarg, "0x%x", &data);
			if (ret < 1) {
				fprintf(stderr, "invalid data\n");
				return -1;
			}
			break;

		case 's':
			size = atoi(optarg);
			if (size < 0 || size > 4) {
				fprintf(stderr, "invalid size\n");
				return -1;
			}
			break;

		case 'h':
		default:
			usage();
			return -1;
		}
	}

	ret = nettlp_pcie_cfg_init(&ntpc);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_init");
		return -1;
	}

	ret = nettlp_pcie_cfg_write(&ntpc, addr, &data, size);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_write");
		return -1;
	}
	
	return 0;
}